

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

void __thiscall netbase_tests::netbase_lookupnumeric::test_method(netbase_lookupnumeric *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar3;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  lazy_ostream local_2d8;
  undefined1 *local_2c8;
  char **local_2c0;
  allocator<char> local_2b2;
  allocator<char> local_2b1;
  assertion_result local_2b0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x81;
  file.m_begin = (iterator)&local_288;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_298,msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"127.0.0.1",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"127.0.0.1:65535",&local_2b2);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_58,&local_78);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "TestParse(\"127.0.0.1\", \"127.0.0.1:65535\")";
  local_2e0 = "";
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2f0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d8,1,0,WARN,_cVar3,(size_t)&local_2f8,0x81);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x82;
  file_00.m_begin = (iterator)&local_308;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_318,
             msg_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"127.0.0.1:8333",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"127.0.0.1:8333",&local_2b2);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_98,&local_b8);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "TestParse(\"127.0.0.1:8333\", \"127.0.0.1:8333\")";
  local_2e0 = "";
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_320 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d8,1,0,WARN,_cVar3,(size_t)&local_328,0x82);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x83;
  file_01.m_begin = (iterator)&local_338;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_348,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"::ffff:127.0.0.1",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"127.0.0.1:65535",&local_2b2);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_d8,&local_f8);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "TestParse(\"::ffff:127.0.0.1\", \"127.0.0.1:65535\")";
  local_2e0 = "";
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_350 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d8,1,0,WARN,_cVar3,(size_t)&local_358,0x83);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x84;
  file_02.m_begin = (iterator)&local_368;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_378,
             msg_02);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"::",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"[::]:65535",&local_2b2);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_118,&local_138);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "TestParse(\"::\", \"[::]:65535\")";
  local_2e0 = "";
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_380 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d8,1,0,WARN,_cVar3,(size_t)&local_388,0x84);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x85;
  file_03.m_begin = (iterator)&local_398;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3a8,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"[::]:8333",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"[::]:8333",&local_2b2);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_158,&local_178);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "TestParse(\"[::]:8333\", \"[::]:8333\")";
  local_2e0 = "";
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3b0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d8,1,0,WARN,_cVar3,(size_t)&local_3b8,0x85);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x86;
  file_04.m_begin = (iterator)&local_3c8;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3d8,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"[127.0.0.1]",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"127.0.0.1:65535",&local_2b2);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_198,&local_1b8);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "TestParse(\"[127.0.0.1]\", \"127.0.0.1:65535\")";
  local_2e0 = "";
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3e0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d8,1,0,WARN,_cVar3,(size_t)&local_3e8,0x86);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x87;
  file_05.m_begin = (iterator)&local_3f8;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_408,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,":::",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"[::]:0",&local_2b2);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_1d8,&local_1f8);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "TestParse(\":::\", \"[::]:0\")";
  local_2e0 = "";
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_410 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d8,1,0,WARN,_cVar3,(size_t)&local_418,0x87);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x8a;
  file_06.m_begin = (iterator)&local_428;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_438,
             msg_06);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"[fd6b:88c0:8724:1:2:3:4:5]",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"[::]:0",&local_2b2);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_218,&local_238);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "TestParse(\"[fd6b:88c0:8724:1:2:3:4:5]\", \"[::]:0\")";
  local_2e0 = "";
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_440 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d8,1,0,WARN,_cVar3,(size_t)&local_448,0x8a);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x8c;
  file_07.m_begin = (iterator)&local_458;
  msg_07.m_end = pvVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_468,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"[fd6c:88c0:8724:1:2:3:4:5]",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"[fd6c:88c0:8724:1:2:3:4:5]:65535",&local_2b2);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_258,&local_278);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "TestParse(\"[fd6c:88c0:8724:1:2:3:4:5]\", \"[fd6c:88c0:8724:1:2:3:4:5]:65535\")";
  local_2e0 = "";
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_470 = "";
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d8,1,0,WARN,_cVar3,(size_t)&local_478,0x8c);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(netbase_lookupnumeric)
{
    BOOST_CHECK(TestParse("127.0.0.1", "127.0.0.1:65535"));
    BOOST_CHECK(TestParse("127.0.0.1:8333", "127.0.0.1:8333"));
    BOOST_CHECK(TestParse("::ffff:127.0.0.1", "127.0.0.1:65535"));
    BOOST_CHECK(TestParse("::", "[::]:65535"));
    BOOST_CHECK(TestParse("[::]:8333", "[::]:8333"));
    BOOST_CHECK(TestParse("[127.0.0.1]", "127.0.0.1:65535"));
    BOOST_CHECK(TestParse(":::", "[::]:0"));

    // verify that an internal address fails to resolve
    BOOST_CHECK(TestParse("[fd6b:88c0:8724:1:2:3:4:5]", "[::]:0"));
    // and that a one-off resolves correctly
    BOOST_CHECK(TestParse("[fd6c:88c0:8724:1:2:3:4:5]", "[fd6c:88c0:8724:1:2:3:4:5]:65535"));
}